

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O1

void vsencoding::__vseblocks_unpack5(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  
  if (0x1f < bs + 0x1f) {
    uVar16 = bs + 0x1f >> 5;
    auVar2 = vpmovsxbd_avx(ZEXT416(0x70c1116));
    auVar20._8_4_ = 0x1f;
    auVar20._0_8_ = 0x1f0000001f;
    auVar20._12_4_ = 0x1f;
    auVar3 = vpmovsxbd_avx(ZEXT416(0xe13181d));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x409));
    auVar10 = vpmovsxbd_avx2(ZEXT816(0x401060b10151a1f));
    auVar11 = vpmovsxbd_avx2(ZEXT816(0x101f1f1f1f1f1f00));
    auVar5 = vpmovsxbd_avx(ZEXT416(0xd12171c));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x308));
    auVar7 = vpmovsxbd_avx(ZEXT416(0xf14191e));
    auVar8 = vpmovsxbd_avx(ZEXT416(0x50a));
    do {
      uVar1 = *in;
      *out = uVar1 >> 0x1b;
      auVar18 = vpbroadcastd_avx512vl();
      auVar18 = vpsrlvd_avx2(auVar18,auVar2);
      auVar18 = vpand_avx(auVar18,auVar20);
      *(undefined1 (*) [16])(out + 1) = auVar18;
      out[5] = uVar1 >> 2 & 0x1f;
      uVar15 = (uVar1 & 3) << 3;
      out[6] = uVar15;
      uVar1 = in[1];
      auVar19 = vpbroadcastd_avx512vl();
      auVar13 = vpsrlvd_avx2(auVar19,auVar3);
      auVar18 = vpinsrd_avx(auVar20,uVar15,0);
      auVar9 = vpor_avx(auVar13,auVar18);
      auVar18 = vpand_avx(auVar13,auVar20);
      auVar18 = vpblendd_avx2(auVar18,auVar9,1);
      *(undefined1 (*) [16])(out + 6) = auVar18;
      auVar18 = vpsrlvd_avx2(auVar19,auVar4);
      auVar18 = vpand_avx(auVar18,auVar20);
      *(long *)(out + 10) = auVar18._0_8_;
      uVar17 = uVar1 * 2 & 0x1e;
      out[0xc] = uVar17;
      uVar1 = in[2];
      auVar21._4_4_ = uVar1;
      auVar21._0_4_ = uVar1;
      auVar21._8_4_ = uVar1;
      auVar21._12_4_ = uVar1;
      auVar21._16_4_ = uVar1;
      auVar21._20_4_ = uVar1;
      auVar21._24_4_ = uVar1;
      auVar21._28_4_ = uVar1;
      auVar14 = vpsrlvd_avx2(auVar21,auVar10);
      auVar21 = vpsllvd_avx2(auVar21,auVar10);
      auVar21 = vpblendd_avx2(auVar14,auVar21,0x80);
      auVar12 = vpblendd_avx2(ZEXT432(uVar17),auVar11,0xfe);
      auVar21 = vpand_avx2(auVar21,auVar12);
      auVar12 = vpor_avx2(auVar14,ZEXT432(uVar17));
      auVar12 = vpblendd_avx2(auVar21,auVar12,1);
      *(undefined1 (*) [32])(out + 0xc) = auVar12;
      uVar1 = in[3];
      auVar19 = vpbroadcastd_avx512vl();
      auVar13 = vpsrlvd_avx2(auVar19,auVar5);
      auVar18 = vpshufd_avx(auVar21._16_16_,0xff);
      auVar9 = vpor_avx(auVar13,auVar18);
      auVar18 = vpand_avx(auVar13,auVar20);
      auVar18 = vpblendd_avx2(auVar18,auVar9,1);
      *(undefined1 (*) [16])(out + 0x13) = auVar18;
      auVar18 = vpsrlvd_avx2(auVar19,auVar6);
      auVar18 = vpand_avx(auVar18,auVar20);
      *(long *)(out + 0x17) = auVar18._0_8_;
      uVar15 = (uVar1 & 7) << 2;
      out[0x19] = uVar15;
      uVar1 = in[4];
      auVar19 = vpbroadcastd_avx512vl();
      auVar13 = vpsrlvd_avx2(auVar19,auVar7);
      auVar18 = vpinsrd_avx(auVar20,uVar15,0);
      auVar9 = vpor_avx(auVar13,auVar18);
      auVar18 = vpand_avx(auVar13,auVar20);
      auVar18 = vpblendd_avx2(auVar18,auVar9,1);
      *(undefined1 (*) [16])(out + 0x19) = auVar18;
      auVar18 = vpsrlvd_avx2(auVar19,auVar8);
      auVar18 = vpand_avx(auVar18,auVar20);
      *(long *)(out + 0x1d) = auVar18._0_8_;
      out[0x1f] = uVar1 & 0x1f;
      out = out + 0x20;
      in = in + 5;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack5(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 5, --bs) {
    out[0] = in[0] >> 27;
    out[1] = (in[0] >> 22) & 0x1f;
    out[2] = (in[0] >> 17) & 0x1f;
    out[3] = (in[0] >> 12) & 0x1f;
    out[4] = (in[0] >> 7) & 0x1f;
    out[5] = (in[0] >> 2) & 0x1f;
    out[6] = (in[0] << 3) & 0x1f;
    out[6] |= in[1] >> 29;
    out[7] = (in[1] >> 24) & 0x1f;
    out[8] = (in[1] >> 19) & 0x1f;
    out[9] = (in[1] >> 14) & 0x1f;
    out[10] = (in[1] >> 9) & 0x1f;
    out[11] = (in[1] >> 4) & 0x1f;
    out[12] = (in[1] << 1) & 0x1f;
    out[12] |= in[2] >> 0x1f;
    out[13] = (in[2] >> 26) & 0x1f;
    out[14] = (in[2] >> 21) & 0x1f;
    out[15] = (in[2] >> 16) & 0x1f;
    out[16] = (in[2] >> 11) & 0x1f;
    out[17] = (in[2] >> 6) & 0x1f;
    out[18] = (in[2] >> 1) & 0x1f;
    out[19] = (in[2] << 4) & 0x1f;
    out[19] |= in[3] >> 28;
    out[20] = (in[3] >> 23) & 0x1f;
    out[21] = (in[3] >> 18) & 0x1f;
    out[22] = (in[3] >> 13) & 0x1f;
    out[23] = (in[3] >> 8) & 0x1f;
    out[24] = (in[3] >> 3) & 0x1f;
    out[25] = (in[3] << 2) & 0x1f;
    out[25] |= in[4] >> 30;
    out[26] = (in[4] >> 25) & 0x1f;
    out[27] = (in[4] >> 20) & 0x1f;
    out[28] = (in[4] >> 15) & 0x1f;
    out[29] = (in[4] >> 10) & 0x1f;
    out[30] = (in[4] >> 5) & 0x1f;
    out[31] = in[4] & 0x1f;
  }
}